

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsChartElement.cpp
# Opt level: O3

void __thiscall KDReports::ChartElement::ChartElement(ChartElement *this,Chart *chart)

{
  QSharedDataPointer<KDReports::ChartElementPrivate> *this_00;
  ChartElementPrivate *pCVar1;
  char local_38 [8];
  char *local_30;
  char *local_28;
  char *local_20;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ChartElement_00173178;
  pCVar1 = (ChartElementPrivate *)operator_new(0x28);
  this_00 = &this->d;
  (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pCVar1->m_tableModel = (QAbstractItemModel *)0x0;
  *(undefined4 *)&(pCVar1->m_size).wd = 0;
  *(undefined4 *)((long)&(pCVar1->m_size).wd + 4) = 0x40590000;
  *(undefined4 *)&(pCVar1->m_size).ht = 0;
  *(undefined4 *)((long)&(pCVar1->m_size).ht + 4) = 0x40590000;
  pCVar1->m_unit = Millimeters;
  pCVar1->m_deleteChart = false;
  this_00->d = pCVar1;
  LOCK();
  (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pCVar1 = this_00->d;
  if ((pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i != 1) {
    QSharedDataPointer<KDReports::ChartElementPrivate>::detach_helper(this_00);
    pCVar1 = this_00->d;
  }
  pCVar1->m_tableModel = (QAbstractItemModel *)0x0;
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = 'Q';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsChartElement.cpp"
  ;
  local_28 = "KDReports::ChartElement::ChartElement(KDChart::Chart *)";
  local_20 = "default";
  QMessageLogger::warning
            (local_38,
             "ChartElement: cannot use chart, KD Reports was compiled without KD Chart support");
  return;
}

Assistant:

KDReports::ChartElement::ChartElement(KDChart::Chart *chart)
    : d(new ChartElementPrivate)
{
    d->m_tableModel = nullptr;
#ifdef HAVE_KDCHART
    d->m_chart = chart;
#else
    Q_UNUSED(chart);
    qWarning("ChartElement: cannot use chart, KD Reports was compiled without KD Chart support");
#endif
}